

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_enc.c
# Opt level: O0

size_t Encode(uint8_t *rgba,int width,int height,int stride,Importer import,float quality_factor,
             int lossless,uint8_t **output)

{
  int iVar1;
  uint uVar2;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  code *in_R8;
  int in_R9D;
  undefined8 *in_stack_00000008;
  int ok;
  WebPMemoryWriter wrt;
  WebPConfig config;
  WebPPicture pic;
  float in_stack_fffffffffffffe28;
  WebPPreset in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  uint uVar3;
  undefined4 in_stack_fffffffffffffe34;
  uint8_t *local_1c8;
  size_t local_1c0;
  WebPPicture *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  uint local_130 [2];
  undefined4 local_128;
  undefined4 local_124;
  code *local_d0;
  uint8_t **local_c8;
  int local_30;
  code *local_28;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined8 local_10;
  
  if (((in_stack_00000008 == (undefined8 *)0x0) ||
      (local_30 = in_R9D, local_28 = in_R8, local_1c = in_ECX, local_18 = in_EDX, local_14 = in_ESI,
      local_10 = in_RDI,
      iVar1 = WebPConfigPreset((WebPConfig *)
                               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                               in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28), iVar1 == 0)) ||
     (iVar1 = WebPPictureInit((WebPPicture *)0x187338), iVar1 == 0)) {
    return 0;
  }
  uVar2 = (uint)(local_30 != 0);
  local_130[0] = (uint)(local_30 != 0);
  local_128 = local_14;
  local_124 = local_18;
  local_d0 = WebPMemoryWrite;
  local_c8 = &local_1c8;
  WebPMemoryWriterInit((WebPMemoryWriter *)&local_1c8);
  iVar1 = (*local_28)(local_130,local_10,local_1c);
  uVar3 = 0;
  if (iVar1 != 0) {
    iVar1 = WebPEncode((WebPConfig *)CONCAT44(uVar2,in_stack_fffffffffffffe58),
                       in_stack_fffffffffffffe50);
    uVar3 = (uint)(iVar1 != 0) << 0x18;
  }
  uVar3 = uVar3 >> 0x18;
  WebPPictureFree((WebPPicture *)0x187427);
  if (uVar3 != 0) {
    *in_stack_00000008 = local_1c8;
    return local_1c0;
  }
  WebPMemoryWriterClear((WebPMemoryWriter *)0x187438);
  *in_stack_00000008 = 0;
  return 0;
}

Assistant:

static size_t Encode(const uint8_t* rgba, int width, int height, int stride,
                     Importer import, float quality_factor, int lossless,
                     uint8_t** output) {
  WebPPicture pic;
  WebPConfig config;
  WebPMemoryWriter wrt;
  int ok;

  if (output == NULL) return 0;

  if (!WebPConfigPreset(&config, WEBP_PRESET_DEFAULT, quality_factor) ||
      !WebPPictureInit(&pic)) {
    return 0;  // shouldn't happen, except if system installation is broken
  }

  config.lossless = !!lossless;
  pic.use_argb = !!lossless;
  pic.width = width;
  pic.height = height;
  pic.writer = WebPMemoryWrite;
  pic.custom_ptr = &wrt;
  WebPMemoryWriterInit(&wrt);

  ok = import(&pic, rgba, stride) && WebPEncode(&config, &pic);
  WebPPictureFree(&pic);
  if (!ok) {
    WebPMemoryWriterClear(&wrt);
    *output = NULL;
    return 0;
  }
  *output = wrt.mem;
  return wrt.size;
}